

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crc32.cc
# Opt level: O2

uint32_t crc32_1(void *data,size_t len,uint32_t prev_value)

{
  uint uVar1;
  size_t sVar2;
  
  uVar1 = ~prev_value;
  for (sVar2 = 0; len != sVar2; sVar2 = sVar2 + 1) {
    uVar1 = uVar1 >> 8 ^ crc_lookup[0][(uint)*(byte *)((long)data + sVar2) ^ uVar1 & 0xff];
  }
  return ~uVar1;
}

Assistant:

uint32_t crc32_1(const void* data, size_t len, uint32_t prev_value)
{
    uint32_t crc = ~prev_value;
    const uint8_t* cur = (const uint8_t*) data;

    while (len-- > 0)
        crc = (crc >> 8) ^ crc_lookup[0][(crc & 0xFF) ^ *cur++];

    return ~crc;
}